

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O2

void __thiscall SO3LimitMap::test_method(SO3LimitMap *this)

{
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  VectorXd expectedRes;
  double i;
  VectorXd res;
  Index dim;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_120;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_100 [24];
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  SO3<mnf::ExpMapQuaternion> S;
  
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&S);
  dim = mnf::Manifold::dim();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&res,&dim);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_100,&res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (type *)0x0);
  mnf::Manifold::limitMap(&S,local_100);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&expectedRes,&dim);
  i = 1.8137993642342178;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_120,&expectedRes,&i);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_120,&i);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(this_00,&i);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_120);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0x7f);
  local_120.m_row._0_1_ = 0;
  local_120.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)&PTR__lazy_ostream_00153ad0;
  local_120.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
  local_120.m_currentBlockRows = 0x13f2c4;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_e0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&local_120,&local_e8,0x7f,1,2,&expectedRes,"expectedRes",
             &res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,"res");
  free(expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  mnf::SO3<mnf::ExpMapQuaternion>::~SO3(&S);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SO3LimitMap)
{
  SO3<ExpMapQuaternion> S;
  Index dim = S.dim();
  Eigen::VectorXd res(dim);
  S.limitMap(res);
  Eigen::VectorXd expectedRes(dim);
  double i = M_PI / sqrt(3);
  expectedRes << i, i, i;
  BOOST_CHECK_EQUAL(expectedRes, res);
}